

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::DOMNormalizer::integerToXMLCh(DOMNormalizer *this,uint i)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *pXVar2;
  XMLCh *copy;
  XMLCh *pos;
  XMLCh *buf;
  uint i_local;
  DOMNormalizer *this_local;
  
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x1e);
  copy = (XMLCh *)(CONCAT44(extraout_var,iVar1) + 0xc);
  *copy = L'\0';
  buf._4_4_ = i;
  do {
    switch(buf._4_4_ % 10) {
    case 0:
      copy[-1] = L'0';
      copy = copy + -1;
      break;
    case 1:
      copy[-1] = L'1';
      copy = copy + -1;
      break;
    case 2:
      copy[-1] = L'2';
      copy = copy + -1;
      break;
    case 3:
      copy[-1] = L'3';
      copy = copy + -1;
      break;
    case 4:
      copy[-1] = L'4';
      copy = copy + -1;
      break;
    case 5:
      copy[-1] = L'5';
      copy = copy + -1;
      break;
    case 6:
      copy[-1] = L'6';
      copy = copy + -1;
      break;
    case 7:
      copy[-1] = L'7';
      copy = copy + -1;
      break;
    case 8:
      copy[-1] = L'8';
      copy = copy + -1;
      break;
    case 9:
      copy[-1] = L'9';
      copy = copy + -1;
    }
    buf._4_4_ = buf._4_4_ / 10;
  } while (buf._4_4_ != 0);
  pXVar2 = DOMDocumentImpl::getPooledString(this->fDocument,copy);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,CONCAT44(extraout_var,iVar1))
  ;
  return pXVar2;
}

Assistant:

const XMLCh * DOMNormalizer::integerToXMLCh(unsigned int i) const {
    XMLCh *buf = (XMLCh*) fMemoryManager->allocate(15 * sizeof(XMLCh));//new XMLCh[15];
	XMLCh *pos = buf + sizeof(buf) - sizeof(XMLCh);
	*pos = chNull;

	do {
        switch(i % 10) {
        case 0 : *--pos = chDigit_0;break;
        case 1 : *--pos = chDigit_1;break;
        case 2 : *--pos = chDigit_2;break;
        case 3 : *--pos = chDigit_3;break;
        case 4 : *--pos = chDigit_4;break;
        case 5 : *--pos = chDigit_5;break;
        case 6 : *--pos = chDigit_6;break;
        case 7 : *--pos = chDigit_7;break;
        case 8 : *--pos = chDigit_8;break;
        case 9 : *--pos = chDigit_9;break;
        default:;
        }
		i /= 10;
	} while (i);

    const XMLCh *copy = fDocument->getPooledString(pos);
    fMemoryManager->deallocate(buf);//delete[] buf;
	return copy;
}